

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O0

void draco::parser::ParseLine(DecoderBuffer *buffer,string *out_string)

{
  bool bVar1;
  long in_RSI;
  DecoderBuffer *in_RDI;
  bool bVar2;
  bool is_delim;
  char last_delim;
  int num_delims;
  char c;
  char local_19;
  int local_18;
  char local_11;
  long local_10;
  DecoderBuffer *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RSI != 0) {
    std::__cxx11::string::clear();
  }
  local_18 = 0;
  do {
    bVar1 = DecoderBuffer::Peek<char>(local_8,&local_11);
    if (!bVar1) {
      return;
    }
    bVar1 = local_11 == '\r';
    bVar2 = local_11 == '\n';
    if (bVar1 || bVar2) {
      if (local_18 == 0) {
        local_19 = local_11;
      }
      else {
        if (local_18 != 1) {
          return;
        }
        if (local_11 == local_19) {
          return;
        }
        if (local_11 != '\n') {
          return;
        }
      }
      local_18 = local_18 + 1;
    }
    if ((!bVar1 && !bVar2) && (0 < local_18)) {
      return;
    }
    DecoderBuffer::Advance(local_8,1);
    if ((!bVar1 && !bVar2) && (local_10 != 0)) {
      std::__cxx11::string::push_back((char)local_10);
    }
  } while( true );
}

Assistant:

void ParseLine(DecoderBuffer *buffer, std::string *out_string) {
  if (out_string) {
    out_string->clear();
  }
  char c;
  int num_delims = 0;
  char last_delim;
  while (buffer->Peek(&c)) {
    // Check if |c| is a delimiter symbol. We want to identify all possible
    // delimiters that can occur on different platforms (i.e. we want to detect
    // '\r\n', '\r', '\n').
    const bool is_delim = (c == '\r' || c == '\n');

    if (is_delim) {
      if (num_delims == 0) {
        last_delim = c;
      } else if (num_delims == 1) {
        // We already parsed either '\r' or '\n'. Ensure the new delim symbol is
        // '\n' and different from the previous symbol.
        if (c == last_delim || c != '\n') {
          return;  // Same delimiter symbol already processed.
        }
      } else {
        // Too many delimiter symbols.
        return;
      }
      num_delims++;
    }

    if (!is_delim && num_delims > 0) {
      // We reached a non-delimiter symbol after a delimiter was already found.
      // Stop the parsing.
      return;
    }

    buffer->Advance(1);

    // We put the non-delimiter symbol into the output string.
    if (!is_delim && out_string) {
      out_string->push_back(c);
    }
  }
}